

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeBufferApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::framebuffer_texture(NegativeTestContext *ctx)

{
  bool bVar1;
  ContextType ctxType;
  ApiType requiredApiType;
  RenderContext *pRVar2;
  allocator<char> local_f9;
  string local_f8;
  allocator<char> local_d1;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_49;
  string local_48;
  GLuint local_28 [2];
  GLuint texture [2];
  GLuint fbo;
  NegativeTestContext *ctx_local;
  
  pRVar2 = NegativeTestContext::getRenderContext(ctx);
  ctxType.super_ApiType.m_bits = (ApiType)(*pRVar2->_vptr_RenderContext[2])();
  requiredApiType = glu::ApiType::es(3,2);
  bVar1 = glu::contextSupports(ctxType,requiredApiType);
  if (bVar1) {
    texture[1] = 0x1234;
    local_28[0] = 0x1234;
    local_28[1] = 0x1234;
    glu::CallLogWrapper::glGenFramebuffers(&ctx->super_CallLogWrapper,1,texture + 1);
    glu::CallLogWrapper::glBindFramebuffer(&ctx->super_CallLogWrapper,0x8d40,texture[1]);
    glu::CallLogWrapper::glGenTextures(&ctx->super_CallLogWrapper,2,local_28);
    glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0xde1,local_28[0]);
    glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0x8c2a,local_28[1]);
    NegativeTestContext::expectError(ctx,0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,
               "GL_INVALID_ENUM is generated if target is not one of the accepted tokens.",&local_49
              );
    NegativeTestContext::beginSection(ctx,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    glu::CallLogWrapper::glFramebufferTexture
              (&ctx->super_CallLogWrapper,0xffffffff,0x8ce0,local_28[0],0);
    NegativeTestContext::expectError(ctx,0x500);
    NegativeTestContext::endSection(ctx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,
               "GL_INVALID_ENUM is generated if attachment is not one of the accepted tokens.",
               &local_81);
    NegativeTestContext::beginSection(ctx,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator(&local_81);
    glu::CallLogWrapper::glFramebufferTexture
              (&ctx->super_CallLogWrapper,0x8d40,0xffffffff,local_28[0],0);
    NegativeTestContext::expectError(ctx,0x500);
    NegativeTestContext::endSection(ctx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,
               "GL_INVALID_OPERATION is generated if texture is neither 0 nor the name of an existing texture object."
               ,&local_a9);
    NegativeTestContext::beginSection(ctx,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator(&local_a9);
    glu::CallLogWrapper::glFramebufferTexture(&ctx->super_CallLogWrapper,0x8d40,0x8ce0,0xffffffff,0)
    ;
    NegativeTestContext::expectError(ctx,0x501);
    NegativeTestContext::endSection(ctx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"GL_INVALID_OPERATION is generated if zero is bound to target.",
               &local_d1);
    NegativeTestContext::beginSection(ctx,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator(&local_d1);
    glu::CallLogWrapper::glBindFramebuffer(&ctx->super_CallLogWrapper,0x8d40,0);
    glu::CallLogWrapper::glFramebufferTexture(&ctx->super_CallLogWrapper,0x8d40,0x8ce0,0,0);
    NegativeTestContext::expectError(ctx,0x502);
    glu::CallLogWrapper::glBindFramebuffer(&ctx->super_CallLogWrapper,0x8d40,texture[1]);
    NegativeTestContext::endSection(ctx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,
               "GL_INVALID_OPERATION is generated by if texture is a buffer texture.",&local_f9);
    NegativeTestContext::beginSection(ctx,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator(&local_f9);
    glu::CallLogWrapper::glFramebufferTexture
              (&ctx->super_CallLogWrapper,0x8d40,0x8ce0,local_28[1],0);
    NegativeTestContext::expectError(ctx,0x502);
    NegativeTestContext::endSection(ctx);
    glu::CallLogWrapper::glDeleteFramebuffers(&ctx->super_CallLogWrapper,1,texture + 1);
    glu::CallLogWrapper::glDeleteBuffers(&ctx->super_CallLogWrapper,2,local_28);
  }
  return;
}

Assistant:

void framebuffer_texture (NegativeTestContext& ctx)
{
	if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)))
	{
		GLuint fbo = 0x1234;
		GLuint texture[] = {0x1234, 0x1234};

		ctx.glGenFramebuffers(1, &fbo);
		ctx.glBindFramebuffer(GL_FRAMEBUFFER, fbo);
		ctx.glGenTextures(2, texture);
		ctx.glBindTexture(GL_TEXTURE_2D, texture[0]);
		ctx.glBindTexture(GL_TEXTURE_BUFFER, texture[1]);
		ctx.expectError(GL_NO_ERROR);

		ctx.beginSection("GL_INVALID_ENUM is generated if target is not one of the accepted tokens.");
		ctx.glFramebufferTexture(-1, GL_COLOR_ATTACHMENT0, texture[0], 0);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.endSection();

		ctx.beginSection("GL_INVALID_ENUM is generated if attachment is not one of the accepted tokens.");
		ctx.glFramebufferTexture(GL_FRAMEBUFFER, -1, texture[0], 0);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.endSection();

		ctx.beginSection("GL_INVALID_OPERATION is generated if texture is neither 0 nor the name of an existing texture object.");
		ctx.glFramebufferTexture(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, -1, 0);
		ctx.expectError(GL_INVALID_VALUE);
		ctx.endSection();

		ctx.beginSection("GL_INVALID_OPERATION is generated if zero is bound to target.");
		ctx.glBindFramebuffer(GL_FRAMEBUFFER, 0);
		ctx.glFramebufferTexture(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, 0, 0);
		ctx.expectError(GL_INVALID_OPERATION);
		ctx.glBindFramebuffer(GL_FRAMEBUFFER, fbo);
		ctx.endSection();

		ctx.beginSection("GL_INVALID_OPERATION is generated by if texture is a buffer texture.");
		ctx.glFramebufferTexture(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, texture[1], 0);
		ctx.expectError(GL_INVALID_OPERATION);
		ctx.endSection();

		ctx.glDeleteFramebuffers(1, &fbo);
		ctx.glDeleteBuffers(2, texture);
	}
}